

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessage
          (ExtensionSet *this,int number,MessageLite *prototype,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  int field_number;
  int cached_size;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar1;
  CppType *v1_00;
  CppType *v2_00;
  undefined1 auVar2 [16];
  MessageLite *msg;
  LogMessageFatal local_e0 [23];
  Voidify local_c9;
  CppType local_c8;
  CppType local_c4;
  string *local_c0;
  undefined1 local_b8 [16];
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  anon_enum_32 local_90;
  anon_enum_32 local_8c;
  string *local_88;
  string *absl_log_internal_check_op_result;
  byte local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  LogMessageFatal local_58 [23];
  Voidify local_41;
  Extension *local_40;
  Extension *extension;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MessageLite *prototype_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)prototype;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  local_40 = FindOrNull(this,number);
  local_69 = 0;
  if (local_40 == (Extension *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x210,local_68._M_len,local_68._M_str);
    local_69 = 1;
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_58);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [12])"not present");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar1);
  }
  if ((local_69 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
  }
  local_8c = (anon_enum_32)((local_40->is_repeated & 1U) == 0);
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_8c);
  local_90 = OPTIONAL_FIELD;
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_90);
  local_88 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (v1,v2,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  if (local_88 != (string *)0x0) {
    local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x211,local_b8._0_8_,local_b8._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a8);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
  }
  local_c4 = anon_unknown_58::cpp_type(local_40->type);
  v1_00 = absl::lts_20240722::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_c4);
  local_c8 = CPPTYPE_MESSAGE;
  v2_00 = absl::lts_20240722::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_c8);
  local_c0 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE"
                       );
  field_number = prototype_local._4_4_;
  if (local_c0 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x211,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_e0);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_c9,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_e0);
  }
  if (((byte)local_40->field_0xa >> 2 & 1) == 0) {
    this_00 = local_40->field_0;
    cached_size = MessageLite::GetCachedSize(this_00);
    this_local = (ExtensionSet *)
                 WireFormatLite::InternalWriteMessage
                           (field_number,(MessageLite *)this_00,cached_size,(uint8_t *)stream_local,
                            (EpsCopyOutputStream *)extension);
  }
  else {
    this_local = (ExtensionSet *)
                 (**(code **)(**(long **)&(local_40->field_0).int32_t_value + 0x98))
                           (*(long **)&(local_40->field_0).int32_t_value,target_local,
                            prototype_local._4_4_,stream_local,extension);
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessage(
    int number, const MessageLite* prototype, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "not present";
  ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);

  if (extension->is_lazy) {
    return extension->ptr.lazymessage_value->WriteMessageToArray(
        prototype, number, target, stream);
  }

  const auto* msg = extension->ptr.message_value;
  return WireFormatLite::InternalWriteMessage(
      number, *msg, msg->GetCachedSize(), target, stream);
}